

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

void init_motion_compensation_nstep(search_site_config *cfg,int stride,int level)

{
  uint uVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  int local_68;
  short local_64;
  undefined2 uStack_62;
  short local_60;
  undefined4 local_5e;
  short local_5a;
  undefined2 local_58;
  short local_56;
  short local_54;
  short local_52;
  short local_50;
  short local_4e;
  short local_4c;
  short local_4a;
  short local_48;
  short local_46;
  short local_44;
  short local_42;
  FULLPEL_MV search_site_mvs [13];
  
  cfg->stride = stride;
  uVar1 = (0 < level) + 0xf;
  piVar2 = &cfg->site[0][0].offset;
  uVar5 = 0;
  iVar6 = 1;
  do {
    iVar4 = (int)((double)iVar6 * 0.41);
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    bVar3 = 5 < iVar6 && level < 1;
    local_68 = 0;
    local_60 = (short)iVar6;
    local_64 = -local_60;
    uStack_62 = 0;
    local_5e = 0;
    local_5a = local_64;
    local_58 = 0;
    local_56 = local_60;
    if (5 >= iVar6 || level >= 1) {
      iVar4 = iVar6;
    }
    local_54 = local_64;
    local_4e = (short)iVar4;
    local_52 = -local_4e;
    local_50 = local_60;
    local_4c = local_52;
    local_4a = local_60;
    local_48 = local_4e;
    local_46 = local_64;
    local_44 = local_64;
    local_42 = local_4e;
    search_site_mvs[0].row = local_60;
    search_site_mvs[0].col = local_52;
    search_site_mvs[1].row = local_4e;
    search_site_mvs[1].col = local_60;
    search_site_mvs[2].row = local_52;
    search_site_mvs[2].col = local_64;
    uVar7 = 0;
    do {
      iVar4 = (&local_68)[uVar7];
      piVar2[uVar7 * 2 + -1] = iVar4;
      piVar2[uVar7 * 2] = (iVar4 >> 0x10) + (short)iVar4 * stride;
      uVar7 = uVar7 + 1;
    } while ((uint)bVar3 * 4 + 9 != uVar7);
    cfg->searches_per_step[uVar5] = (uint)bVar3 * 4 + 8;
    cfg->radius[uVar5] = iVar6;
    if (uVar5 < 0xc) {
      dVar8 = (double)iVar6 * 1.5 + 0.5;
      if (dVar8 <= (double)(iVar6 + 1)) {
        dVar8 = (double)(iVar6 + 1);
      }
      iVar6 = (int)dVar8;
    }
    uVar5 = uVar5 + 1;
    piVar2 = piVar2 + 0x22;
  } while (uVar5 != uVar1);
  cfg->num_search_steps = uVar1;
  return;
}

Assistant:

static void init_motion_compensation_nstep(search_site_config *cfg, int stride,
                                           int level) {
  int num_search_steps = 0;
  int stage_index = 0;
  cfg->stride = stride;
  int radius = 1;
  const int num_stages = (level > 0) ? 16 : 15;
  for (stage_index = 0; stage_index < num_stages; ++stage_index) {
    int tan_radius = AOMMAX((int)(0.41 * radius), 1);
    int num_search_pts = 12;
    if ((radius <= 5) || (level > 0)) {
      tan_radius = radius;
      num_search_pts = 8;
    }
    const FULLPEL_MV search_site_mvs[13] = {
      { 0, 0 },
      { -radius, 0 },
      { radius, 0 },
      { 0, -radius },
      { 0, radius },
      { -radius, -tan_radius },
      { radius, tan_radius },
      { -tan_radius, radius },
      { tan_radius, -radius },
      { -radius, tan_radius },
      { radius, -tan_radius },
      { tan_radius, radius },
      { -tan_radius, -radius },
    };

    for (int i = 0; i <= num_search_pts; ++i) {
      search_site *const site = &cfg->site[stage_index][i];
      site->mv = search_site_mvs[i];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    cfg->searches_per_step[stage_index] = num_search_pts;
    cfg->radius[stage_index] = radius;
    ++num_search_steps;
    if (stage_index < 12)
      radius = (int)AOMMAX((radius * 1.5 + 0.5), radius + 1);
  }
  cfg->num_search_steps = num_search_steps;
}